

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

DescriptorProto *
google::protobuf::descriptor_unittest::AddMessage(FileDescriptorProto *file,string *name)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar1;
  Arena *arena;
  
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(file->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  arena = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(pVVar1->field_0)._impl_.name_,name,arena);
  return pVVar1;
}

Assistant:

DescriptorProto* AddMessage(FileDescriptorProto* file,
                            const std::string& name) {
  DescriptorProto* result = file->add_message_type();
  result->set_name(name);
  return result;
}